

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_reader_utils.c
# Opt level: O0

uint32_t VP8LReadBits(VP8LBitReader *br,int n_bits)

{
  uint32_t uVar1;
  int iVar2;
  int in_ESI;
  VP8LBitReader *in_RDI;
  int new_bits;
  uint32_t val;
  undefined4 in_stack_ffffffffffffffe0;
  uint local_4;
  
  if ((in_RDI->eos_ == 0) && (in_ESI < 0x19)) {
    uVar1 = VP8LPrefetchBits(in_RDI);
    local_4 = uVar1 & kBitMask[in_ESI];
    iVar2 = in_RDI->bit_pos_ + in_ESI;
    in_RDI->bit_pos_ = iVar2;
    ShiftBytes((VP8LBitReader *)CONCAT44(iVar2,in_stack_ffffffffffffffe0));
  }
  else {
    VP8LSetEndOfStream(in_RDI);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

uint32_t VP8LReadBits(VP8LBitReader* const br, int n_bits) {
  assert(n_bits >= 0);
  // Flag an error if end_of_stream or n_bits is more than allowed limit.
  if (!br->eos_ && n_bits <= VP8L_MAX_NUM_BIT_READ) {
    const uint32_t val = VP8LPrefetchBits(br) & kBitMask[n_bits];
    const int new_bits = br->bit_pos_ + n_bits;
    br->bit_pos_ = new_bits;
    ShiftBytes(br);
    return val;
  } else {
    VP8LSetEndOfStream(br);
    return 0;
  }
}